

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-object.c
# Opt level: O1

void fmt_array(hd_context *ctx,fmt *fmt,pdf_obj *obj)

{
  char *pcVar1;
  int iVar2;
  pdf_obj *ppVar3;
  int c;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  int iVar5;
  int i;
  
  iVar2 = pdf_array_len(ctx,obj);
  iVar5 = (int)extraout_RDX;
  fmt->sep = 0;
  pcVar1 = fmt->buf;
  if (fmt->tight == 0) {
    if ((pcVar1 != (char *)0x0) && (fmt->len < fmt->cap)) {
      pcVar1[fmt->len] = '[';
    }
    fmt->col = fmt->col + 1;
    fmt->len = fmt->len + 1;
    fmt->last = 0x5b;
    fmt->indent = fmt->indent + 1;
    if (0 < iVar2) {
      i = 0;
      uVar4 = extraout_RDX;
      do {
        if (fmt->col < 0x3d) {
          fmt_putc((hd_context *)fmt,(fmt *)0x20,(int)uVar4);
        }
        else {
          fmt_putc((hd_context *)fmt,(fmt *)0xa,(int)uVar4);
          uVar4 = extraout_RDX_00;
          for (iVar5 = fmt->indent; iVar5 != 0; iVar5 = iVar5 + -1) {
            fmt_putc((hd_context *)fmt,(fmt *)0x20,(int)uVar4);
            fmt_putc((hd_context *)fmt,(fmt *)0x20,c);
            uVar4 = extraout_RDX_01;
          }
        }
        ppVar3 = pdf_array_get(ctx,obj,i);
        fmt_obj(ctx,fmt,ppVar3);
        iVar5 = (int)extraout_RDX_02;
        i = i + 1;
        uVar4 = extraout_RDX_02;
      } while (i != iVar2);
    }
    fmt->indent = fmt->indent + -1;
    fmt_putc((hd_context *)fmt,(fmt *)0x20,iVar5);
    fmt->sep = 0;
    if ((fmt->buf != (char *)0x0) && (fmt->len < fmt->cap)) {
      fmt->buf[fmt->len] = ']';
    }
    fmt->col = fmt->col + 1;
    fmt->len = fmt->len + 1;
    fmt->sep = 1;
    fmt->last = 0x5d;
  }
  else {
    if ((pcVar1 != (char *)0x0) && (fmt->len < fmt->cap)) {
      pcVar1[fmt->len] = '[';
    }
    fmt->col = fmt->col + 1;
    fmt->len = fmt->len + 1;
    fmt->last = 0x5b;
    if (0 < iVar2) {
      iVar5 = 0;
      do {
        ppVar3 = pdf_array_get(ctx,obj,iVar5);
        fmt_obj(ctx,fmt,ppVar3);
        fmt->sep = 1;
        iVar5 = iVar5 + 1;
      } while (iVar2 != iVar5);
    }
    fmt->sep = 0;
    if ((fmt->buf != (char *)0x0) && (fmt->len < fmt->cap)) {
      fmt->buf[fmt->len] = ']';
    }
    fmt->col = fmt->col + 1;
    fmt->len = fmt->len + 1;
    fmt->last = 0x5d;
  }
  return;
}

Assistant:

static void fmt_array(hd_context *ctx, struct fmt *fmt, pdf_obj *obj)
{
    int i, n;

    n = pdf_array_len(ctx, obj);
    if (fmt->tight) {
        fmt_putc(ctx, fmt, '[');
        for (i = 0; i < n; i++) {
            fmt_obj(ctx, fmt, pdf_array_get(ctx, obj, i));
            fmt_sep(ctx, fmt);
        }
        fmt_putc(ctx, fmt, ']');
    }
    else {
        fmt_putc(ctx, fmt, '[');
        fmt->indent ++;
        for (i = 0; i < n; i++) {
            if (fmt->col > 60) {
                fmt_putc(ctx, fmt, '\n');
                fmt_indent(ctx, fmt);
            } else {
                fmt_putc(ctx, fmt, ' ');
            }
            fmt_obj(ctx, fmt, pdf_array_get(ctx, obj, i));
        }
        fmt->indent --;
        fmt_putc(ctx, fmt, ' ');
        fmt_putc(ctx, fmt, ']');
        fmt_sep(ctx, fmt);
    }
}